

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O2

void __thiscall TPZStructMatrix::SetMesh(TPZStructMatrix *this,TPZCompMesh *mesh)

{
  int64_t iVar1;
  
  this->fMesh = mesh;
  if (mesh == (TPZCompMesh *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = TPZCompMesh::NEquations(mesh);
  }
  (this->fEquationFilter).fNumEq = iVar1;
  return;
}

Assistant:

void TPZStructMatrix::SetMesh(TPZCompMesh *mesh) {
    fMesh = mesh;
    fEquationFilter.SetNumEq(mesh ? mesh->NEquations() : 0);
#ifdef PZDEBUG
    if (mesh) {
        TPZCheckMesh checkmesh(fMesh, &std::cout);
        if (checkmesh.CheckConnectSeqNumberConsistency() != 0) {
            DebugStop();
        }
    }
#endif
}